

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::testAtomicDraw
          (FunctionalTest12 *this,GLuint subroutine_index,GLuint *expected_results)

{
  ostringstream *this_00;
  GLuint GVar1;
  GLuint GVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  long *plVar8;
  GLuint local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  local_1b4 = subroutine_index;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar7 + 0x1668))(0x8b30,1,&local_1b4);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17dc);
  (**(code **)(lVar7 + 0x538))(0,0,1);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17e0);
  plVar8 = (long *)(**(code **)(lVar7 + 0xcf8))(0x92c0,35000);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17e4);
  lVar3 = *(long *)expected_results;
  lVar4 = *plVar8;
  GVar1 = expected_results[2];
  GVar2 = *(GLuint *)(plVar8 + 1);
  if (GVar1 != GVar2 || lVar3 != lVar4) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Error. Invalid result. ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Result: [ ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected: [ ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ]",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  (**(code **)(lVar7 + 0x1670))(0x92c0);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x17f4);
  return GVar1 == GVar2 && lVar3 == lVar4;
}

Assistant:

bool FunctionalTest12::testAtomicDraw(GLuint subroutine_index, const GLuint expected_results[3]) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &subroutine_index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Draw */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Capture results */
	GLuint* atomic_results = (GLuint*)gl.mapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	/* Verify */
	bool result = (0 == memcmp(expected_results, atomic_results, 3 * sizeof(GLuint)));

	if (false == result)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error. Invalid result. "
			<< "Result: [ " << atomic_results[0] << ", " << atomic_results[1] << ", " << atomic_results[2] << " ] "
			<< "Expected: [ " << expected_results[0] << ", " << expected_results[1] << ", " << expected_results[2]
			<< " ]" << tcu::TestLog::EndMessage;
	}

	/* Unmap buffer */
	gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Done */
	return result;
}